

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O2

void Acb_ObjAddFanins(Acb_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int i;
  
  if (vFanins != (Vec_Int_t *)0x0) {
    for (i = 0; i < vFanins->nSize; i = i + 1) {
      iVar2 = Vec_IntEntry(vFanins,i);
      piVar3 = Acb_ObjFanins(p,iObj);
      if (iVar2 < 1) {
        __assert_fail("iFanin > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x1a3,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
      }
      iVar1 = *piVar3;
      if (piVar3[(long)iVar1 + 1] != -1) {
        __assert_fail("pFanins[ 1 + pFanins[0] ] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x1a4,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
      }
      *piVar3 = iVar1 + 1;
      piVar3[(long)iVar1 + 1] = iVar2;
    }
  }
  return;
}

Assistant:

static inline void Acb_ObjAddFanins( Acb_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    int i, iFanin;
    if ( vFanins )
        Vec_IntForEachEntry( vFanins, iFanin, i )
            Acb_ObjAddFanin( p, iObj, iFanin );
}